

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int stem(char **pz,char *zFrom,char *zTo,_func_int_char_ptr *xCond)

{
  int iVar1;
  char *pcVar2;
  
  pcVar2 = *pz;
  while( true ) {
    if (*zFrom == '\0') {
      if ((xCond == (_func_int_char_ptr *)0x0) || (iVar1 = (*xCond)(pcVar2), iVar1 != 0)) {
        for (; *zTo != '\0'; zTo = zTo + 1) {
          pcVar2[-1] = *zTo;
          pcVar2 = pcVar2 + -1;
        }
        *pz = pcVar2;
      }
      return 1;
    }
    if (*zFrom != *pcVar2) break;
    pcVar2 = pcVar2 + 1;
    zFrom = zFrom + 1;
  }
  return 0;
}

Assistant:

static int stem(
  char **pz,             /* The word being stemmed (Reversed) */
  const char *zFrom,     /* If the ending matches this... (Reversed) */
  const char *zTo,       /* ... change the ending to this (not reversed) */
  int (*xCond)(const char*)   /* Condition that must be true */
){
  char *z = *pz;
  while( *zFrom && *zFrom==*z ){ z++; zFrom++; }
  if( *zFrom!=0 ) return 0;
  if( xCond && !xCond(z) ) return 1;
  while( *zTo ){
    *(--z) = *(zTo++);
  }
  *pz = z;
  return 1;
}